

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_buildBlockEntropyStats
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,
                 ZSTD_entropyCTablesMetadata_t *entropyMetadata,void *workspace,size_t wkspSize)

{
  void *workSpace;
  ZSTD_strategy ZVar1;
  ZSTD_paramSwitch_e ZVar2;
  BYTE *source;
  BYTE *pBVar3;
  U32 maxSymbolValue;
  HUF_repeat HVar4;
  uint uVar5;
  size_t err_code;
  size_t sVar6;
  size_t wkspSize_00;
  long lVar7;
  ulong sourceSize;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  symbolEncodingType_e sVar12;
  bool bVar13;
  undefined8 uVar14;
  ZSTD_symbolEncodingTypeStats_t local_58;
  
  source = seqStorePtr->litStart;
  pBVar3 = seqStorePtr->lit;
  ZVar1 = (cctxParams->cParams).strategy;
  ZVar2 = cctxParams->literalCompressionMode;
  if (ZVar2 == ZSTD_ps_auto) {
    if (ZVar1 != ZSTD_fast) goto LAB_001447a5;
    uVar5 = (cctxParams->cParams).targetLength;
    local_58.LLtype = 0xff;
    HVar4 = (prevEntropy->huf).repeatMode;
    memcpy(nextEntropy,prevEntropy,0x810);
    sVar12 = set_basic;
    if (uVar5 == 0) goto LAB_001447e3;
LAB_001449e1:
    (entropyMetadata->hufMetadata).hType = sVar12;
    (entropyMetadata->hufMetadata).hufDesSize = 0;
  }
  else {
    if (ZVar2 != ZSTD_ps_enable) {
      if (ZVar2 != ZSTD_ps_disable) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4652,"int ZSTD_literalsCompressionIsDisabled(const ZSTD_CCtx_params *)");
      }
      sVar12 = set_basic;
LAB_0014472d:
      memcpy(nextEntropy,prevEntropy,0x810);
      goto LAB_001449e1;
    }
LAB_001447a5:
    local_58.LLtype = 0xff;
    HVar4 = (prevEntropy->huf).repeatMode;
    memcpy(nextEntropy,prevEntropy,0x810);
LAB_001447e3:
    sourceSize = (long)pBVar3 - (long)source;
    uVar9 = 0x3f;
    if ((prevEntropy->huf).repeatMode == HUF_repeat_valid) {
      uVar9 = 6;
    }
    sVar12 = set_basic;
    if (sourceSize <= uVar9) goto LAB_001449e1;
    sVar6 = HIST_count_wksp((uint *)workspace,&local_58.LLtype,source,sourceSize,workspace,wkspSize)
    ;
    maxSymbolValue = local_58.LLtype;
    if (0xffffffffffffff88 < sVar6) goto LAB_00144ad8;
    sVar12 = set_rle;
    if ((sVar6 == sourceSize) || (sVar12 = set_basic, sVar6 <= (sourceSize >> 7) + 4))
    goto LAB_001449e1;
    workSpace = (void *)((long)workspace + 0x400);
    wkspSize_00 = wkspSize - 0x400;
    uVar9 = (ulong)local_58.LLtype;
    if (HVar4 == HUF_repeat_check) {
      bVar13 = false;
      if (-1 < (int)local_58.LLtype) {
        lVar10 = 0;
        do {
          bVar13 = (bool)(bVar13 | ((char)(prevEntropy->huf).CTable[lVar10 + 1] == '\0' &&
                                   *(int *)((long)workspace + lVar10 * 4) != 0));
          lVar10 = lVar10 + 1;
        } while (uVar9 + 1 != lVar10);
        HVar4 = (HUF_repeat)!bVar13;
        goto LAB_001448eb;
      }
    }
    else {
LAB_001448eb:
      bVar13 = HVar4 == HUF_repeat_none;
    }
    memset(nextEntropy,0,0x808);
    uVar5 = HUF_optimalTableLog(0xb,sourceSize,maxSymbolValue,workSpace,wkspSize_00,
                                (HUF_CElt *)nextEntropy,(uint *)workspace,
                                (uint)(ZSTD_btopt < ZVar1) * 2);
    if (0xb < uVar5) {
      __assert_fail("huffLog <= LitHufLog",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5e8e,
                    "size_t ZSTD_buildBlockEntropyStats_literals(void *const, size_t, const ZSTD_hufCTables_t *, ZSTD_hufCTables_t *, ZSTD_hufCTablesMetadata_t *, const int, void *, size_t, int)"
                   );
    }
    sVar6 = HUF_buildCTable_wksp
                      ((HUF_CElt *)nextEntropy,(uint *)workspace,maxSymbolValue,uVar5,workSpace,
                       wkspSize_00);
    if (0xffffffffffffff88 < sVar6) {
LAB_00144ad8:
      (entropyMetadata->hufMetadata).hufDesSize = sVar6;
      return sVar6;
    }
    if ((int)maxSymbolValue < 0) {
      uVar9 = HUF_writeCTable_wksp
                        ((entropyMetadata->hufMetadata).hufDesBuffer,0x80,(HUF_CElt *)nextEntropy,
                         maxSymbolValue,(uint)sVar6,workSpace,wkspSize_00);
      uVar11 = 0;
      uVar8 = 0;
      if (!bVar13) goto LAB_00144b45;
    }
    else {
      lVar10 = uVar9 + 1;
      lVar7 = 0;
      uVar11 = 0;
      do {
        uVar11 = uVar11 + (ulong)*(uint *)((long)workspace + lVar7 * 4) *
                          (ulong)(byte)(nextEntropy->huf).CTable[lVar7 + 1];
        lVar7 = lVar7 + 1;
      } while (lVar10 != lVar7);
      uVar11 = uVar11 >> 3;
      uVar9 = HUF_writeCTable_wksp
                        ((entropyMetadata->hufMetadata).hufDesBuffer,0x80,(HUF_CElt *)nextEntropy,
                         maxSymbolValue,(uint)sVar6,workSpace,wkspSize_00);
      if (!bVar13) {
        lVar7 = 0;
        uVar8 = 0;
        do {
          uVar8 = uVar8 + (ulong)*(uint *)((long)workspace + lVar7 * 4) *
                          (ulong)(byte)(prevEntropy->huf).CTable[lVar7 + 1];
          lVar7 = lVar7 + 1;
        } while (lVar10 != lVar7);
        uVar8 = uVar8 >> 3;
LAB_00144b45:
        if ((uVar8 < sourceSize) &&
           ((sVar12 = set_repeat, uVar8 <= uVar9 + uVar11 || (sourceSize <= uVar9 + 0xc))))
        goto LAB_0014472d;
      }
    }
    sVar12 = set_basic;
    if (sourceSize <= uVar11 + uVar9) goto LAB_0014472d;
    (entropyMetadata->hufMetadata).hType = set_compressed;
    (nextEntropy->huf).repeatMode = HUF_repeat_check;
    (entropyMetadata->hufMetadata).hufDesSize = uVar9;
    if (0xffffffffffffff88 < uVar9) {
      return uVar9;
    }
  }
  lVar10 = (long)seqStorePtr->sequences - (long)seqStorePtr->sequencesStart;
  if (lVar10 == 0) {
    (nextEntropy->fse).litlength_repeatMode = FSE_repeat_none;
    (nextEntropy->fse).offcode_repeatMode = FSE_repeat_none;
    (nextEntropy->fse).matchlength_repeatMode = FSE_repeat_none;
    uVar14 = 0;
    local_58.MLtype = set_basic;
    local_58.size = 0;
    local_58.lastCountSize = 0;
  }
  else {
    ZSTD_buildSequencesStatistics
              (&local_58,seqStorePtr,lVar10 >> 3,&prevEntropy->fse,&nextEntropy->fse,
               (entropyMetadata->fseMetadata).fseTablesBuffer,
               &(entropyMetadata->fseMetadata).field_0x91,(cctxParams->cParams).strategy,
               (uint *)workspace,(void *)((long)workspace + 0xd4),wkspSize - 0xd4);
    if (0xffffffffffffff88 < local_58.size) goto LAB_00144ab3;
    uVar14 = CONCAT44(local_58.Offtype,local_58.LLtype);
  }
  (entropyMetadata->fseMetadata).llType = (int)uVar14;
  (entropyMetadata->fseMetadata).ofType = (int)((ulong)uVar14 >> 0x20);
  (entropyMetadata->fseMetadata).mlType = local_58.MLtype;
  (entropyMetadata->fseMetadata).lastCountSize = local_58.lastCountSize;
LAB_00144ab3:
  (entropyMetadata->fseMetadata).fseTablesSize = local_58.size;
  sVar6 = 0;
  if (0xffffffffffffff88 < local_58.size) {
    sVar6 = local_58.size;
  }
  return sVar6;
}

Assistant:

size_t ZSTD_buildBlockEntropyStats(
            const seqStore_t* seqStorePtr,
            const ZSTD_entropyCTables_t* prevEntropy,
                  ZSTD_entropyCTables_t* nextEntropy,
            const ZSTD_CCtx_params* cctxParams,
                  ZSTD_entropyCTablesMetadata_t* entropyMetadata,
                  void* workspace, size_t wkspSize)
{
    size_t const litSize = (size_t)(seqStorePtr->lit - seqStorePtr->litStart);
    int const huf_useOptDepth = (cctxParams->cParams.strategy >= HUF_OPTIMAL_DEPTH_THRESHOLD);
    int const hufFlags = huf_useOptDepth ? HUF_flags_optimalDepth : 0;

    entropyMetadata->hufMetadata.hufDesSize =
        ZSTD_buildBlockEntropyStats_literals(seqStorePtr->litStart, litSize,
                                            &prevEntropy->huf, &nextEntropy->huf,
                                            &entropyMetadata->hufMetadata,
                                            ZSTD_literalsCompressionIsDisabled(cctxParams),
                                            workspace, wkspSize, hufFlags);

    FORWARD_IF_ERROR(entropyMetadata->hufMetadata.hufDesSize, "ZSTD_buildBlockEntropyStats_literals failed");
    entropyMetadata->fseMetadata.fseTablesSize =
        ZSTD_buildBlockEntropyStats_sequences(seqStorePtr,
                                              &prevEntropy->fse, &nextEntropy->fse,
                                              cctxParams,
                                              &entropyMetadata->fseMetadata,
                                              workspace, wkspSize);
    FORWARD_IF_ERROR(entropyMetadata->fseMetadata.fseTablesSize, "ZSTD_buildBlockEntropyStats_sequences failed");
    return 0;
}